

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIfWhileForUntil.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckIfWhileForUntil(Parser *this,uint after)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  uint in_ESI;
  long in_RDI;
  bool hasErrors;
  char *val;
  size_t length;
  uint in_stack_000000f4;
  char *in_stack_000000f8;
  Parser *in_stack_00000100;
  bool local_21;
  
  *(undefined1 *)(in_RDI + 0x52) = 1;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x498),"Number of spaces after If/While/For should be");
  __s = (char *)operator_new__(200);
  snprintf(__s,200," = %d",(ulong)in_ESI);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x498),__s);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  bVar1 = FindIfWhileForUntil(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  bVar2 = FindIfWhileForUntil(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  local_21 = !bVar2 || !bVar1;
  bVar1 = FindIfWhileForUntil(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  if (!bVar1) {
    local_21 = true;
  }
  bVar1 = FindIfWhileForUntil(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  if (!bVar1) {
    local_21 = true;
  }
  return (bool)((local_21 ^ 0xffU) & 1);
}

Assistant:

bool Parser::CheckIfWhileForUntil(unsigned int after)
{
  m_TestsDone[IFWHILEFORUNTIL] = true;
  m_TestsDescription[IFWHILEFORUNTIL] =
    "Number of spaces after If/While/For should be";
  constexpr size_t length = 200;
  char* val = new char[length];
  snprintf(val,length," = %d",after);
  m_TestsDescription[IFWHILEFORUNTIL] += val;
  delete [] val;

  bool hasErrors = false;
  
  if(!this->FindIfWhileForUntil("if",after))
    {
    hasErrors = true;
    }
  if(!this->FindIfWhileForUntil("while",after))
    {
    hasErrors = true;
    }
  if(!this->FindIfWhileForUntil("for",after))
    {
    hasErrors = true;
    }
  if(!this->FindIfWhileForUntil("until",after))
    {
    hasErrors = true;
    }

  return !hasErrors;
}